

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

bool __thiscall
Lib::Set<SAT::SATLiteral,_Lib::DefaultHash>::contains
          (Set<SAT::SATLiteral,_Lib::DefaultHash> *this,SATLiteral val)

{
  uint uVar1;
  Cell *pCVar2;
  ulong uVar3;
  SATLiteral val_local;
  
  val_local = val;
  uVar1 = SAT::SATLiteral::defaultHash(&val_local);
  uVar3 = 2;
  if (2 < uVar1) {
    uVar3 = (ulong)uVar1;
  }
  pCVar2 = this->_entries + uVar3 % (ulong)(uint)this->_capacity;
  while ((uVar1 = pCVar2->code, uVar1 != 0 &&
         ((uVar1 != (uint)uVar3 ||
          ((anon_union_4_2_6ac8864f_for_SATLiteral_0)(pCVar2->value).field_0._content !=
           val_local.field_0))))) {
    pCVar2 = pCVar2 + 1;
    if (pCVar2 == this->_afterLast) {
      pCVar2 = this->_entries;
    }
  }
  return uVar1 != 0;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }